

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O0

void __thiscall
Hospital::Update_Patient_File
          (Hospital *this,vector<Patient,_std::allocator<Patient>_> *All_Of_Patients,
          ofstream *inFile)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  ostream *poVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_250;
  int local_234;
  int local_230;
  int j;
  int i;
  ostream local_220 [8];
  ofstream abus;
  ofstream *inFile_local;
  vector<Patient,_std::allocator<Patient>_> *All_Of_Patients_local;
  Hospital *this_local;
  
  system("pause");
  std::ofstream::ofstream(local_220);
  std::ofstream::open((char *)local_220,0x1312ab);
  local_230 = 0;
  while( true ) {
    uVar1 = (ulong)local_230;
    sVar2 = std::vector<Patient,_std::allocator<Patient>_>::size(All_Of_Patients);
    if (sVar2 <= uVar1) break;
    local_234 = 0;
    while( true ) {
      uVar1 = (ulong)local_234;
      pvVar3 = std::vector<Patient,_std::allocator<Patient>_>::operator[]
                         (All_Of_Patients,(long)local_230);
      Patient::patient_all_ino_getter_abi_cxx11_(&local_250,pvVar3);
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_250);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_250);
      if (sVar2 <= uVar1) break;
      pvVar3 = std::vector<Patient,_std::allocator<Patient>_>::operator[]
                         (All_Of_Patients,(long)local_230);
      Patient::patient_all_ino_getter_abi_cxx11_(&local_268,pvVar3);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_268,(long)local_234);
      poVar5 = std::operator<<(local_220,(string *)pvVar4);
      std::operator<<(poVar5," ");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_268);
      local_234 = local_234 + 1;
    }
    std::operator<<(local_220,"\n");
    local_230 = local_230 + 1;
  }
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

void Hospital:: Update_Patient_File ( vector<Patient>&All_Of_Patients , ofstream& inFile) {
    system("pause");
    //  cout << "hiiiii";
    ofstream abus;
    abus.open("Patients.txt");
    //abus <<"Asghar";

    for (int i = 0; i < All_Of_Patients.size(); i++) {
        for (int j = 0; j < All_Of_Patients[i].patient_all_ino_getter().size(); ++j) {
            abus << All_Of_Patients[i].patient_all_ino_getter()[j] << " ";
//            abus <<"Asghar";
        }
        abus << "\n";
    }
    //inFile.close();

}